

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vint4_sse2.h
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::InstanceArrayIntersectorK<4>_>,_false>
     ::intersectCoherent(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,
                        RayQueryContext *context)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  bool bVar22;
  uint uVar23;
  undefined4 uVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong *puVar28;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  Primitive_conflict4 *prim;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar35 [16];
  vint4 ai;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 ai_1;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 ai_3;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  vint4 bi;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [64];
  vint4 bi_1;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [64];
  vint4 bi_3;
  undefined1 auVar53 [16];
  vint4 ai_2;
  vint4 bi_2;
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  Precalculations pre;
  vbool<4> valid_leaf;
  vint<4> octant;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  Precalculations local_26f1;
  ulong local_26f0;
  ulong uStack_26e8;
  undefined1 local_26e0 [32];
  float local_26c0;
  float fStack_26bc;
  float fStack_26b8;
  float fStack_26b4;
  float local_26b0;
  float fStack_26ac;
  float fStack_26a8;
  float fStack_26a4;
  float local_26a0;
  float fStack_269c;
  float fStack_2698;
  float fStack_2694;
  undefined1 local_2690 [16];
  AccelData *local_2678;
  ulong local_2670;
  RayHitK<4> *local_2668;
  RayQueryContext *local_2660;
  ulong local_2658;
  ulong local_2650;
  ulong local_2648;
  undefined1 local_2640 [32];
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined4 local_25d0;
  undefined4 uStack_25cc;
  undefined4 uStack_25c8;
  undefined4 uStack_25c4;
  undefined1 local_25c0 [16];
  undefined1 local_25b0 [16];
  float local_25a0;
  float fStack_259c;
  float fStack_2598;
  float fStack_2594;
  float local_2590;
  float fStack_258c;
  float fStack_2588;
  float fStack_2584;
  float local_2580;
  float fStack_257c;
  float fStack_2578;
  float fStack_2574;
  undefined1 local_2570 [16];
  uint local_2560;
  uint uStack_255c;
  uint uStack_2558;
  uint uStack_2554;
  uint uStack_2550;
  uint uStack_254c;
  uint uStack_2548;
  uint uStack_2544;
  undefined4 local_2540;
  undefined4 uStack_253c;
  undefined4 uStack_2538;
  undefined4 uStack_2534;
  undefined4 uStack_2530;
  undefined4 uStack_252c;
  undefined4 uStack_2528;
  undefined4 uStack_2524;
  uint local_2520;
  uint uStack_251c;
  uint uStack_2518;
  uint uStack_2514;
  uint uStack_2510;
  uint uStack_250c;
  uint uStack_2508;
  uint uStack_2504;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  uint local_24e0;
  uint uStack_24dc;
  uint uStack_24d8;
  uint uStack_24d4;
  uint uStack_24d0;
  uint uStack_24cc;
  uint uStack_24c8;
  uint uStack_24c4;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  uint local_24a0;
  uint uStack_249c;
  uint uStack_2498;
  uint uStack_2494;
  uint uStack_2490;
  uint uStack_248c;
  uint uStack_2488;
  uint uStack_2484;
  float local_2480;
  float fStack_247c;
  float fStack_2478;
  float fStack_2474;
  float fStack_2470;
  float fStack_246c;
  float fStack_2468;
  float fStack_2464;
  uint local_2460;
  uint uStack_245c;
  uint uStack_2458;
  uint uStack_2454;
  uint uStack_2450;
  uint uStack_244c;
  uint uStack_2448;
  uint uStack_2444;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  uint local_2420;
  uint uStack_241c;
  uint uStack_2418;
  uint uStack_2414;
  uint uStack_2410;
  uint uStack_240c;
  uint uStack_2408;
  uint uStack_2404;
  undefined8 local_2400;
  undefined8 uStack_23f8;
  undefined8 uStack_23f0;
  undefined8 uStack_23e8;
  uint local_23e0;
  uint uStack_23dc;
  uint uStack_23d8;
  uint uStack_23d4;
  uint uStack_23d0;
  uint uStack_23cc;
  uint uStack_23c8;
  uint uStack_23c4;
  float local_23c0;
  float fStack_23bc;
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  ulong local_23a0;
  undefined4 local_2398 [2];
  ulong local_2390 [1132];
  
  auVar4 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
  auVar34 = vpcmpeqd_avx(auVar4,(undefined1  [16])valid_i->field_0);
  uVar23 = vmovmskps_avx(auVar34);
  if (uVar23 == 0) {
    return;
  }
  local_2678 = This->ptr;
  local_2670 = (ulong)(uVar23 & 0xff);
  auVar54 = *(undefined1 (*) [16])(ray + 0x40);
  auVar38._8_4_ = 0x7fffffff;
  auVar38._0_8_ = 0x7fffffff7fffffff;
  auVar38._12_4_ = 0x7fffffff;
  auVar39 = vandps_avx(auVar54,auVar38);
  auVar44._8_4_ = 0x219392ef;
  auVar44._0_8_ = 0x219392ef219392ef;
  auVar44._12_4_ = 0x219392ef;
  auVar39 = vcmpps_avx(auVar39,auVar44,1);
  auVar41 = vblendvps_avx(auVar54,auVar44,auVar39);
  auVar39 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar38);
  auVar39 = vcmpps_avx(auVar39,auVar44,1);
  auVar45 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar44,auVar39);
  auVar39 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar38);
  auVar39 = vcmpps_avx(auVar39,auVar44,1);
  auVar39 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar44,auVar39);
  auVar38 = vrcpps_avx(auVar41);
  auVar47._8_4_ = 0x3f800000;
  auVar47._0_8_ = &DAT_3f8000003f800000;
  auVar47._12_4_ = 0x3f800000;
  auVar41 = vfnmadd213ps_fma(auVar41,auVar38,auVar47);
  local_2600 = vfmadd132ps_fma(auVar41,auVar38,auVar38);
  auVar57 = ZEXT1664(local_2600);
  auVar41 = vrcpps_avx(auVar45);
  auVar45 = vfnmadd213ps_fma(auVar45,auVar41,auVar47);
  local_2610 = vfmadd132ps_fma(auVar45,auVar41,auVar41);
  auVar58 = ZEXT1664(local_2610);
  auVar41 = vrcpps_avx(auVar39);
  auVar39 = vfnmadd213ps_fma(auVar39,auVar41,auVar47);
  local_2620 = vfmadd132ps_fma(auVar39,auVar41,auVar41);
  auVar59 = ZEXT1664(local_2620);
  auVar41 = ZEXT816(0) << 0x20;
  local_25b0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar41);
  local_25c0 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar41);
  auVar54 = vcmpps_avx(auVar54,auVar41,1);
  auVar39._8_4_ = 1;
  auVar39._0_8_ = 0x100000001;
  auVar39._12_4_ = 1;
  auVar54 = vandps_avx(auVar54,auVar39);
  auVar39 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar41,1);
  auVar45._8_4_ = 2;
  auVar45._0_8_ = 0x200000002;
  auVar45._12_4_ = 2;
  auVar39 = vandps_avx(auVar39,auVar45);
  auVar39 = vorps_avx(auVar39,auVar54);
  auVar54 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar41,1);
  auVar41._8_4_ = 4;
  auVar41._0_8_ = 0x400000004;
  auVar41._12_4_ = 4;
  auVar54 = vandps_avx(auVar54,auVar41);
  auVar4 = vpor_avx(auVar34 ^ auVar4,auVar54);
  local_25e0 = vpor_avx(auVar4,auVar39);
  local_2580 = *(float *)ray;
  fStack_257c = *(float *)(ray + 4);
  fStack_2578 = *(float *)(ray + 8);
  fStack_2574 = *(float *)(ray + 0xc);
  local_2590 = *(float *)(ray + 0x10);
  fStack_258c = *(float *)(ray + 0x14);
  fStack_2588 = *(float *)(ray + 0x18);
  fStack_2584 = *(float *)(ray + 0x1c);
  local_25a0 = *(float *)(ray + 0x20);
  fStack_259c = *(float *)(ray + 0x24);
  fStack_2598 = *(float *)(ray + 0x28);
  fStack_2594 = *(float *)(ray + 0x2c);
  local_2560 = 0x80000000;
  uStack_255c = 0x80000000;
  uStack_2558 = 0x80000000;
  uStack_2554 = 0x80000000;
  uStack_2550 = 0x80000000;
  uStack_254c = 0x80000000;
  uStack_2548 = 0x80000000;
  uStack_2544 = 0x80000000;
  local_25d0 = 0x7f800000;
  uStack_25cc = 0x7f800000;
  uStack_25c8 = 0x7f800000;
  uStack_25c4 = 0x7f800000;
  local_2660 = context;
  local_2668 = ray;
  local_26a0 = local_2600._0_4_ * -*(float *)ray;
  fStack_269c = local_2600._4_4_ * -*(float *)(ray + 4);
  fStack_2698 = local_2600._8_4_ * -*(float *)(ray + 8);
  fStack_2694 = local_2600._12_4_ * -*(float *)(ray + 0xc);
  local_26b0 = local_2610._0_4_ * -*(float *)(ray + 0x10);
  fStack_26ac = local_2610._4_4_ * -*(float *)(ray + 0x14);
  fStack_26a8 = local_2610._8_4_ * -*(float *)(ray + 0x18);
  fStack_26a4 = local_2610._12_4_ * -*(float *)(ray + 0x1c);
  local_26c0 = local_2620._0_4_ * -*(float *)(ray + 0x20);
  fStack_26bc = local_2620._4_4_ * -*(float *)(ray + 0x24);
  fStack_26b8 = local_2620._8_4_ * -*(float *)(ray + 0x28);
  fStack_26b4 = local_2620._12_4_ * -*(float *)(ray + 0x2c);
LAB_00678718:
  lVar27 = 0;
  for (uVar31 = local_2670; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
    lVar27 = lVar27 + 1;
  }
  uVar24 = *(undefined4 *)(local_25e0 + lVar27 * 4);
  auVar34._4_4_ = uVar24;
  auVar34._0_4_ = uVar24;
  auVar34._8_4_ = uVar24;
  auVar34._12_4_ = uVar24;
  auVar36 = vpcmpeqd_avx(auVar34,local_25e0);
  uVar24 = vmovmskps_avx(auVar36);
  local_2670 = ~CONCAT44((int)((ulong)lVar27 >> 0x20),uVar24) & local_2670;
  auVar42._8_4_ = 0x7f800000;
  auVar42._0_8_ = 0x7f8000007f800000;
  auVar42._12_4_ = 0x7f800000;
  auVar4 = vblendvps_avx(auVar42,auVar57._0_16_,auVar36);
  auVar34 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar34 = vminps_avx(auVar34,auVar4);
  auVar54 = vshufpd_avx(auVar34,auVar34,1);
  auVar4 = vblendvps_avx(auVar42,auVar58._0_16_,auVar36);
  auVar34 = vminps_avx(auVar54,auVar34);
  auVar54 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vminps_avx(auVar54,auVar4);
  auVar54 = vshufpd_avx(auVar4,auVar4,1);
  auVar4 = vminps_avx(auVar54,auVar4);
  auVar34 = vinsertps_avx(auVar34,auVar4,0x1c);
  auVar4 = vblendvps_avx(auVar42,auVar59._0_16_,auVar36);
  auVar54 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vminps_avx(auVar54,auVar4);
  auVar54 = vshufpd_avx(auVar4,auVar4,1);
  auVar4 = vminps_avx(auVar54,auVar4);
  auVar38 = vinsertps_avx(auVar34,auVar4,0x20);
  auVar60._8_4_ = 0xff800000;
  auVar60._0_8_ = 0xff800000ff800000;
  auVar60._12_4_ = 0xff800000;
  auVar4 = vblendvps_avx(auVar60,auVar57._0_16_,auVar36);
  auVar34 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar34 = vmaxps_avx(auVar34,auVar4);
  auVar54 = vshufpd_avx(auVar34,auVar34,1);
  auVar4 = vblendvps_avx(auVar60,auVar58._0_16_,auVar36);
  auVar34 = vmaxps_avx(auVar54,auVar34);
  auVar54 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vmaxps_avx(auVar54,auVar4);
  auVar54 = vshufpd_avx(auVar4,auVar4,1);
  auVar4 = vmaxps_avx(auVar54,auVar4);
  auVar34 = vinsertps_avx(auVar34,auVar4,0x1c);
  auVar4 = vblendvps_avx(auVar60,auVar59._0_16_,auVar36);
  auVar54 = vshufps_avx(auVar4,auVar4,0xb1);
  auVar4 = vmaxps_avx(auVar54,auVar4);
  auVar54 = vshufpd_avx(auVar4,auVar4,1);
  auVar4 = vmaxps_avx(auVar54,auVar4);
  auVar44 = vinsertps_avx(auVar34,auVar4,0x20);
  auVar45 = vcmpps_avx(auVar38,_DAT_01feba10,5);
  auVar4 = vblendvps_avx(auVar44,auVar38,auVar45);
  auVar35 = vmovshdup_avx(auVar4);
  local_2648 = (ulong)(auVar35._0_4_ < 0.0) << 5 | 0x40;
  auVar34 = vshufpd_avx(auVar4,auVar4,1);
  uVar33 = (ulong)(auVar34._0_4_ < 0.0) << 5 | 0x80;
  local_2650 = local_2648 ^ 0x20;
  local_23c0 = auVar4._0_4_;
  auVar10._4_4_ = fStack_257c;
  auVar10._0_4_ = local_2580;
  auVar10._8_4_ = fStack_2578;
  auVar10._12_4_ = fStack_2574;
  auVar34 = vblendvps_avx(auVar42,auVar10,auVar36);
  auVar54 = vshufps_avx(auVar34,auVar34,0xb1);
  auVar34 = vminps_avx(auVar54,auVar34);
  auVar54 = vshufpd_avx(auVar34,auVar34,1);
  auVar54 = vminps_avx(auVar54,auVar34);
  auVar5._4_4_ = fStack_258c;
  auVar5._0_4_ = local_2590;
  auVar5._8_4_ = fStack_2588;
  auVar5._12_4_ = fStack_2584;
  auVar34 = vblendvps_avx(auVar42,auVar5,auVar36);
  auVar39 = vshufps_avx(auVar34,auVar34,0xb1);
  auVar34 = vminps_avx(auVar39,auVar34);
  auVar39 = vshufpd_avx(auVar34,auVar34,1);
  auVar34 = vminps_avx(auVar39,auVar34);
  auVar54 = vinsertps_avx(auVar54,auVar34,0x1c);
  auVar6._4_4_ = fStack_259c;
  auVar6._0_4_ = local_25a0;
  auVar6._8_4_ = fStack_2598;
  auVar6._12_4_ = fStack_2594;
  auVar34 = vblendvps_avx(auVar42,auVar6,auVar36);
  auVar39 = vshufps_avx(auVar34,auVar34,0xb1);
  auVar34 = vminps_avx(auVar39,auVar34);
  auVar39 = vshufpd_avx(auVar34,auVar34,1);
  auVar34 = vminps_avx(auVar39,auVar34);
  auVar54 = vinsertps_avx(auVar54,auVar34,0x20);
  auVar34 = vblendvps_avx(auVar60,auVar10,auVar36);
  auVar39 = vshufps_avx(auVar34,auVar34,0xb1);
  auVar34 = vmaxps_avx(auVar39,auVar34);
  auVar39 = vshufpd_avx(auVar34,auVar34,1);
  auVar39 = vmaxps_avx(auVar39,auVar34);
  auVar34 = vblendvps_avx(auVar60,auVar5,auVar36);
  auVar41 = vshufps_avx(auVar34,auVar34,0xb1);
  auVar34 = vmaxps_avx(auVar41,auVar34);
  auVar41 = vshufpd_avx(auVar34,auVar34,1);
  auVar34 = vmaxps_avx(auVar41,auVar34);
  auVar39 = vinsertps_avx(auVar39,auVar34,0x1c);
  auVar34 = vblendvps_avx(auVar60,auVar6,auVar36);
  auVar41 = vshufps_avx(auVar34,auVar34,0xb1);
  auVar34 = vmaxps_avx(auVar41,auVar34);
  auVar41 = vshufpd_avx(auVar34,auVar34,1);
  auVar34 = vmaxps_avx(auVar41,auVar34);
  auVar39 = vinsertps_avx(auVar39,auVar34,0x20);
  auVar34 = vblendvps_avx(auVar39,auVar54,auVar45);
  auVar54 = vblendvps_avx(auVar54,auVar39,auVar45);
  auVar39 = vblendvps_avx(auVar60,local_25c0,auVar36);
  auVar41 = vshufps_avx(auVar39,auVar39,0xb1);
  auVar47 = vmaxps_avx(auVar41,auVar39);
  auVar5 = vshufpd_avx(auVar47,auVar47,1);
  auVar50._8_4_ = 0x7f800000;
  auVar50._0_8_ = 0x7f8000007f800000;
  auVar50._12_4_ = 0x7f800000;
  auVar41 = vblendvps_avx(auVar50,local_25b0,auVar36);
  auVar6 = vshufps_avx(auVar41,auVar41,0xb1);
  auVar41 = vminps_avx(auVar6,auVar41);
  auVar6 = vshufpd_avx(auVar41,auVar41,1);
  auVar6 = vminps_avx(auVar6,auVar41);
  auVar56 = ZEXT1664(CONCAT412(fStack_2694,CONCAT48(fStack_2698,CONCAT44(fStack_269c,local_26a0))));
  auVar41 = vmaxss_avx(auVar5,auVar47);
  auVar52 = ZEXT1664(auVar41);
  auVar55 = ZEXT1664(CONCAT412(fStack_26b4,CONCAT48(fStack_26b8,CONCAT44(fStack_26bc,local_26c0))));
  auVar41 = vblendvps_avx(auVar38,auVar44,auVar45);
  auVar46._0_4_ = auVar54._0_4_ * local_23c0;
  auVar46._4_4_ = auVar54._4_4_ * auVar4._4_4_;
  auVar46._8_4_ = auVar54._8_4_ * auVar4._8_4_;
  auVar46._12_4_ = auVar54._12_4_ * auVar4._12_4_;
  local_2480 = auVar41._0_4_;
  auVar54._0_4_ = auVar34._0_4_ * local_2480;
  auVar54._4_4_ = auVar34._4_4_ * auVar41._4_4_;
  auVar54._8_4_ = auVar34._8_4_ * auVar41._8_4_;
  auVar54._12_4_ = auVar34._12_4_ * auVar41._12_4_;
  uVar31 = (ulong)(local_23c0 < 0.0) << 5;
  local_2658 = uVar31;
  local_23a0 = *(ulong *)&local_2678[1].bounds.bounds0.lower.field_0;
  local_2398[0] = 0;
  fStack_23bc = local_23c0;
  fStack_23b8 = local_23c0;
  fStack_23b4 = local_23c0;
  fStack_23b0 = local_23c0;
  fStack_23ac = local_23c0;
  fStack_23a8 = local_23c0;
  fStack_23a4 = local_23c0;
  local_23e0 = local_2560 ^ (uint)auVar46._0_4_;
  uStack_23dc = uStack_255c ^ (uint)auVar46._0_4_;
  uStack_23d8 = uStack_2558 ^ (uint)auVar46._0_4_;
  uStack_23d4 = uStack_2554 ^ (uint)auVar46._0_4_;
  uStack_23d0 = uStack_2550 ^ (uint)auVar46._0_4_;
  uStack_23cc = uStack_254c ^ (uint)auVar46._0_4_;
  uStack_23c8 = uStack_2548 ^ (uint)auVar46._0_4_;
  uStack_23c4 = uStack_2544 ^ (uint)auVar46._0_4_;
  local_2690._0_8_ = auVar35._0_8_;
  local_2400 = local_2690._0_8_;
  uStack_23f8 = local_2690._0_8_;
  uStack_23f0 = local_2690._0_8_;
  uStack_23e8 = local_2690._0_8_;
  auVar34 = vmovshdup_avx(auVar46);
  uVar23 = auVar34._0_4_;
  uVar7 = auVar34._4_4_;
  local_2420 = local_2560 ^ uVar23;
  uStack_241c = uStack_255c ^ uVar7;
  uStack_2418 = uStack_2558 ^ uVar23;
  uStack_2414 = uStack_2554 ^ uVar7;
  uStack_2410 = uStack_2550 ^ uVar23;
  uStack_240c = uStack_254c ^ uVar7;
  uStack_2408 = uStack_2548 ^ uVar23;
  uStack_2404 = uStack_2544 ^ uVar7;
  auVar4 = vshufps_avx(auVar4,auVar4,0xaa);
  local_2440 = auVar4._0_8_;
  uStack_2438 = local_2440;
  uStack_2430 = local_2440;
  uStack_2428 = local_2440;
  auVar4 = vshufps_avx(auVar46,auVar46,0xaa);
  auVar49 = ZEXT1664(auVar39);
  uVar23 = auVar4._0_4_;
  uVar7 = auVar4._4_4_;
  local_2460 = local_2560 ^ uVar23;
  uStack_245c = uStack_255c ^ uVar7;
  uStack_2458 = uStack_2558 ^ uVar23;
  uStack_2454 = uStack_2554 ^ uVar7;
  uStack_2450 = uStack_2550 ^ uVar23;
  uStack_244c = uStack_254c ^ uVar7;
  uStack_2448 = uStack_2548 ^ uVar23;
  uStack_2444 = uStack_2544 ^ uVar7;
  fStack_247c = local_2480;
  fStack_2478 = local_2480;
  fStack_2474 = local_2480;
  fStack_2470 = local_2480;
  fStack_246c = local_2480;
  fStack_2468 = local_2480;
  fStack_2464 = local_2480;
  local_24a0 = local_2560 ^ (uint)auVar54._0_4_;
  uStack_249c = uStack_255c ^ (uint)auVar54._0_4_;
  uStack_2498 = uStack_2558 ^ (uint)auVar54._0_4_;
  uStack_2494 = uStack_2554 ^ (uint)auVar54._0_4_;
  uStack_2490 = uStack_2550 ^ (uint)auVar54._0_4_;
  uStack_248c = uStack_254c ^ (uint)auVar54._0_4_;
  uStack_2488 = uStack_2548 ^ (uint)auVar54._0_4_;
  uStack_2484 = uStack_2544 ^ (uint)auVar54._0_4_;
  auVar4 = vmovshdup_avx(auVar41);
  local_24c0 = auVar4._0_8_;
  uStack_24b8 = local_24c0;
  uStack_24b0 = local_24c0;
  uStack_24a8 = local_24c0;
  auVar4 = vmovshdup_avx(auVar54);
  uVar23 = auVar4._0_4_;
  uVar7 = auVar4._4_4_;
  local_24e0 = local_2560 ^ uVar23;
  uStack_24dc = uStack_255c ^ uVar7;
  uStack_24d8 = uStack_2558 ^ uVar23;
  uStack_24d4 = uStack_2554 ^ uVar7;
  uStack_24d0 = uStack_2550 ^ uVar23;
  uStack_24cc = uStack_254c ^ uVar7;
  uStack_24c8 = uStack_2548 ^ uVar23;
  uStack_24c4 = uStack_2544 ^ uVar7;
  auVar4 = vshufps_avx(auVar41,auVar41,0xaa);
  local_2500 = auVar4._0_8_;
  uStack_24f8 = local_2500;
  uStack_24f0 = local_2500;
  uStack_24e8 = local_2500;
  auVar4 = vshufps_avx(auVar54,auVar54,0xaa);
  uVar23 = auVar4._0_4_;
  uVar7 = auVar4._4_4_;
  local_2520 = local_2560 ^ uVar23;
  uStack_251c = uStack_255c ^ uVar7;
  uStack_2518 = uStack_2558 ^ uVar23;
  uStack_2514 = uStack_2554 ^ uVar7;
  uStack_2510 = uStack_2550 ^ uVar23;
  uStack_250c = uStack_254c ^ uVar7;
  uStack_2508 = uStack_2548 ^ uVar23;
  uStack_2504 = uStack_2544 ^ uVar7;
  local_2640._0_4_ = auVar6._0_4_;
  local_2540 = local_2640._0_4_;
  uStack_253c = local_2640._0_4_;
  uStack_2538 = local_2640._0_4_;
  uStack_2534 = local_2640._0_4_;
  uStack_2530 = local_2640._0_4_;
  uStack_252c = local_2640._0_4_;
  uStack_2528 = local_2640._0_4_;
  uStack_2524 = local_2640._0_4_;
  auVar4._4_4_ = uStack_25cc;
  auVar4._0_4_ = local_25d0;
  auVar4._8_4_ = uStack_25c8;
  auVar4._12_4_ = uStack_25c4;
  local_2690 = vblendvps_avx(auVar4,local_25b0,auVar36);
  auVar61 = ZEXT1664(CONCAT412(fStack_26a4,CONCAT48(fStack_26a8,CONCAT44(fStack_26ac,local_26b0))));
  puVar28 = local_2390;
  do {
    local_25f0 = auVar52._0_16_;
    uVar24 = auVar52._0_4_;
    local_2640._4_4_ = uVar24;
    local_2640._0_4_ = uVar24;
    local_2640._8_4_ = uVar24;
    local_2640._12_4_ = uVar24;
    local_2640._16_4_ = uVar24;
    local_2640._20_4_ = uVar24;
    local_2640._24_4_ = uVar24;
    local_2640._28_4_ = uVar24;
LAB_00678b21:
    do {
      if (puVar28 == &local_23a0) {
        if (local_2670 == 0) {
          return;
        }
        goto LAB_00678718;
      }
      uVar24 = (undefined4)puVar28[-1];
      auVar35._4_4_ = uVar24;
      auVar35._0_4_ = uVar24;
      auVar35._8_4_ = uVar24;
      auVar35._12_4_ = uVar24;
      auVar52 = ZEXT1664(auVar35);
      puVar28 = puVar28 + -2;
      auVar4 = vcmpps_avx(auVar35,auVar49._0_16_,1);
    } while ((((auVar4 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
              (auVar4 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar4 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar4[0xf])
    ;
    uVar32 = *puVar28;
    while ((uVar32 & 8) == 0) {
      auVar20._4_4_ = uStack_23dc;
      auVar20._0_4_ = local_23e0;
      auVar20._8_4_ = uStack_23d8;
      auVar20._12_4_ = uStack_23d4;
      auVar20._16_4_ = uStack_23d0;
      auVar20._20_4_ = uStack_23cc;
      auVar20._24_4_ = uStack_23c8;
      auVar20._28_4_ = uStack_23c4;
      auVar21._4_4_ = fStack_23bc;
      auVar21._0_4_ = local_23c0;
      auVar21._8_4_ = fStack_23b8;
      auVar21._12_4_ = fStack_23b4;
      auVar21._16_4_ = fStack_23b0;
      auVar21._20_4_ = fStack_23ac;
      auVar21._24_4_ = fStack_23a8;
      auVar21._28_4_ = fStack_23a4;
      auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar32 + 0x40 + local_2658),auVar20,auVar21);
      auVar18._4_4_ = uStack_241c;
      auVar18._0_4_ = local_2420;
      auVar18._8_4_ = uStack_2418;
      auVar18._12_4_ = uStack_2414;
      auVar18._16_4_ = uStack_2410;
      auVar18._20_4_ = uStack_240c;
      auVar18._24_4_ = uStack_2408;
      auVar18._28_4_ = uStack_2404;
      auVar19._8_8_ = uStack_23f8;
      auVar19._0_8_ = local_2400;
      auVar19._16_8_ = uStack_23f0;
      auVar19._24_8_ = uStack_23e8;
      auVar34 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar32 + 0x40 + local_2648),auVar18,auVar19);
      auVar8 = vpmaxsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar34));
      auVar16._4_4_ = uStack_245c;
      auVar16._0_4_ = local_2460;
      auVar16._8_4_ = uStack_2458;
      auVar16._12_4_ = uStack_2454;
      auVar16._16_4_ = uStack_2450;
      auVar16._20_4_ = uStack_244c;
      auVar16._24_4_ = uStack_2448;
      auVar16._28_4_ = uStack_2444;
      auVar17._8_8_ = uStack_2438;
      auVar17._0_8_ = local_2440;
      auVar17._16_8_ = uStack_2430;
      auVar17._24_8_ = uStack_2428;
      auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar32 + 0x40 + uVar33),auVar16,auVar17);
      auVar9._4_4_ = uStack_253c;
      auVar9._0_4_ = local_2540;
      auVar9._8_4_ = uStack_2538;
      auVar9._12_4_ = uStack_2534;
      auVar9._16_4_ = uStack_2530;
      auVar9._20_4_ = uStack_252c;
      auVar9._24_4_ = uStack_2528;
      auVar9._28_4_ = uStack_2524;
      auVar9 = vpmaxsd_avx2(ZEXT1632(auVar4),auVar9);
      local_26e0 = vpmaxsd_avx2(auVar8,auVar9);
      auVar14._4_4_ = uStack_249c;
      auVar14._0_4_ = local_24a0;
      auVar14._8_4_ = uStack_2498;
      auVar14._12_4_ = uStack_2494;
      auVar14._16_4_ = uStack_2490;
      auVar14._20_4_ = uStack_248c;
      auVar14._24_4_ = uStack_2488;
      auVar14._28_4_ = uStack_2484;
      auVar15._4_4_ = fStack_247c;
      auVar15._0_4_ = local_2480;
      auVar15._8_4_ = fStack_2478;
      auVar15._12_4_ = fStack_2474;
      auVar15._16_4_ = fStack_2470;
      auVar15._20_4_ = fStack_246c;
      auVar15._24_4_ = fStack_2468;
      auVar15._28_4_ = fStack_2464;
      auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar32 + 0x40 + (uVar31 ^ 0x20)),auVar14,
                               auVar15);
      auVar8._4_4_ = uStack_24dc;
      auVar8._0_4_ = local_24e0;
      auVar8._8_4_ = uStack_24d8;
      auVar8._12_4_ = uStack_24d4;
      auVar8._16_4_ = uStack_24d0;
      auVar8._20_4_ = uStack_24cc;
      auVar8._24_4_ = uStack_24c8;
      auVar8._28_4_ = uStack_24c4;
      auVar13._8_8_ = uStack_24b8;
      auVar13._0_8_ = local_24c0;
      auVar13._16_8_ = uStack_24b0;
      auVar13._24_8_ = uStack_24a8;
      auVar34 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar32 + 0x40 + local_2650),auVar8,auVar13);
      auVar8 = vpminsd_avx2(ZEXT1632(auVar4),ZEXT1632(auVar34));
      auVar11._4_4_ = uStack_251c;
      auVar11._0_4_ = local_2520;
      auVar11._8_4_ = uStack_2518;
      auVar11._12_4_ = uStack_2514;
      auVar11._16_4_ = uStack_2510;
      auVar11._20_4_ = uStack_250c;
      auVar11._24_4_ = uStack_2508;
      auVar11._28_4_ = uStack_2504;
      auVar12._8_8_ = uStack_24f8;
      auVar12._0_8_ = local_2500;
      auVar12._16_8_ = uStack_24f0;
      auVar12._24_8_ = uStack_24e8;
      auVar4 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar32 + 0x40 + (uVar33 ^ 0x20)),auVar11,
                               auVar12);
      auVar9 = vpminsd_avx2(ZEXT1632(auVar4),local_2640);
      auVar8 = vpminsd_avx2(auVar8,auVar9);
      auVar8 = vcmpps_avx(local_26e0,auVar8,2);
      uVar23 = vmovmskps_avx(auVar8);
      if (uVar23 == 0) {
        bVar22 = false;
        uVar26 = uVar32;
      }
      else {
        uVar29 = (ulong)(uVar23 & 0xff);
        auVar52 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
        uVar30 = 0;
        uVar25 = 8;
        do {
          lVar27 = 0;
          for (uVar26 = uVar29; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
            lVar27 = lVar27 + 1;
          }
          uVar24 = *(undefined4 *)(uVar32 + 0x40 + lVar27 * 4);
          auVar36._4_4_ = uVar24;
          auVar36._0_4_ = uVar24;
          auVar36._8_4_ = uVar24;
          auVar36._12_4_ = uVar24;
          auVar54 = vfmadd213ps_fma(auVar36,auVar57._0_16_,auVar56._0_16_);
          uVar24 = *(undefined4 *)(uVar32 + 0x80 + lVar27 * 4);
          auVar40._4_4_ = uVar24;
          auVar40._0_4_ = uVar24;
          auVar40._8_4_ = uVar24;
          auVar40._12_4_ = uVar24;
          auVar39 = vfmadd213ps_fma(auVar40,auVar58._0_16_,auVar61._0_16_);
          uVar24 = *(undefined4 *)(uVar32 + 0xc0 + lVar27 * 4);
          auVar43._4_4_ = uVar24;
          auVar43._0_4_ = uVar24;
          auVar43._8_4_ = uVar24;
          auVar43._12_4_ = uVar24;
          auVar41 = vfmadd213ps_fma(auVar43,auVar59._0_16_,auVar55._0_16_);
          auVar47 = auVar49._0_16_;
          uVar24 = *(undefined4 *)(uVar32 + 0x60 + lVar27 * 4);
          auVar48._4_4_ = uVar24;
          auVar48._0_4_ = uVar24;
          auVar48._8_4_ = uVar24;
          auVar48._12_4_ = uVar24;
          auVar45 = vfmadd213ps_fma(auVar48,auVar57._0_16_,auVar56._0_16_);
          uVar24 = *(undefined4 *)(uVar32 + 0xa0 + lVar27 * 4);
          auVar51._4_4_ = uVar24;
          auVar51._0_4_ = uVar24;
          auVar51._8_4_ = uVar24;
          auVar51._12_4_ = uVar24;
          auVar38 = vfmadd213ps_fma(auVar51,auVar58._0_16_,auVar61._0_16_);
          uVar24 = *(undefined4 *)(uVar32 + 0xe0 + lVar27 * 4);
          auVar53._4_4_ = uVar24;
          auVar53._0_4_ = uVar24;
          auVar53._8_4_ = uVar24;
          auVar53._12_4_ = uVar24;
          auVar44 = vfmadd213ps_fma(auVar53,auVar59._0_16_,auVar55._0_16_);
          auVar4 = vpminsd_avx(auVar54,auVar45);
          auVar34 = vpminsd_avx(auVar39,auVar38);
          auVar4 = vpmaxsd_avx(auVar4,auVar34);
          auVar34 = vpminsd_avx(auVar41,auVar44);
          auVar34 = vpmaxsd_avx(auVar34,local_2690);
          auVar4 = vpmaxsd_avx(auVar4,auVar34);
          auVar34 = vpmaxsd_avx(auVar54,auVar45);
          auVar49 = ZEXT1664(auVar47);
          auVar54 = vpmaxsd_avx(auVar39,auVar38);
          auVar54 = vpminsd_avx(auVar34,auVar54);
          auVar34 = vpmaxsd_avx(auVar41,auVar44);
          auVar34 = vpminsd_avx(auVar34,auVar47);
          auVar34 = vpminsd_avx(auVar54,auVar34);
          auVar4 = vcmpps_avx(auVar4,auVar34,2);
          uVar26 = uVar25;
          if ((((auVar4 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar4 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar4 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar4[0xf] < '\0') {
            uVar24 = *(undefined4 *)(local_26e0 + lVar27 * 4);
            auVar37._4_4_ = uVar24;
            auVar37._0_4_ = uVar24;
            auVar37._8_4_ = uVar24;
            auVar37._12_4_ = uVar24;
            uVar26 = *(ulong *)(uVar32 + lVar27 * 8);
            auVar34 = auVar52._0_16_;
            auVar4 = vcmpps_avx(auVar37,auVar34,1);
            if ((((auVar4 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                 (auVar4 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar4 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                -1 < auVar4[0xf]) {
              *puVar28 = uVar26;
              uVar26 = uVar25;
            }
            else {
              if (uVar25 == 8) {
                auVar52 = ZEXT1664(auVar37);
                goto LAB_00678d53;
              }
              *puVar28 = uVar25;
              auVar52 = ZEXT1664(auVar37);
              auVar37 = auVar34;
            }
            uVar30 = uVar30 + 1;
            *(int *)(puVar28 + 1) = auVar37._0_4_;
            puVar28 = puVar28 + 2;
          }
LAB_00678d53:
          uVar29 = uVar29 - 1 & uVar29;
          uVar25 = uVar26;
        } while (uVar29 != 0);
        if (uVar26 == 8) {
          bVar22 = false;
        }
        else {
          bVar22 = true;
          if (1 < uVar30) {
            puVar1 = puVar28 + -4;
            puVar2 = puVar28 + -2;
            if ((uint)puVar28[-3] < (uint)puVar28[-1]) {
              local_26f0 = *puVar1;
              uStack_26e8 = puVar28[-3];
              *(int *)(puVar28 + -3) = (int)puVar28[-1];
              *puVar1 = *puVar2;
              *puVar2 = local_26f0;
              *(undefined4 *)(puVar28 + -1) = (undefined4)uStack_26e8;
            }
            if (uVar30 != 2) {
              puVar3 = puVar28 + -6;
              if ((uint)puVar28[-5] < (uint)puVar28[-1]) {
                local_26f0 = *puVar3;
                uStack_26e8 = puVar28[-5];
                *(int *)(puVar28 + -5) = (int)puVar28[-1];
                *puVar3 = *puVar2;
                *puVar2 = local_26f0;
                *(undefined4 *)(puVar28 + -1) = (undefined4)uStack_26e8;
              }
              if ((uint)puVar28[-5] < (uint)puVar28[-3]) {
                local_26f0 = *puVar3;
                uStack_26e8 = puVar28[-5];
                *(int *)(puVar28 + -5) = (int)puVar28[-3];
                *puVar3 = *puVar1;
                *puVar1 = local_26f0;
                *(undefined4 *)(puVar28 + -3) = (undefined4)uStack_26e8;
              }
            }
          }
        }
      }
      uVar32 = uVar26;
      if (!bVar22) goto LAB_00678b21;
    }
    auVar4 = vcmpps_avx(auVar49._0_16_,auVar52._0_16_,6);
    local_26e0._0_16_ = auVar4;
    if ((((auVar4 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar4 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar4 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar4[0xf])
    goto LAB_00678f75;
    local_2570 = auVar49._0_16_;
    lVar27 = (ulong)((uint)uVar32 & 0xf) - 8;
    if (lVar27 != 0) {
      prim = (Primitive_conflict4 *)(uVar32 & 0xfffffffffffffff0);
      do {
        local_2640._0_8_ = lVar27;
        InstanceArrayIntersectorK<4>::intersect((vbool<4> *)local_26e0,&local_26f1,ray,context,prim)
        ;
        prim = prim + 1;
        lVar27 = local_2640._0_8_ + -1;
        context = local_2660;
        ray = local_2668;
      } while (lVar27 != 0);
    }
    auVar49 = ZEXT1664(local_2570);
    auVar4 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),local_2570,1);
    auVar4 = local_26e0._0_16_ & auVar4;
    if ((((auVar4 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar4 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar4 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar4[0xf]) {
      auVar57 = ZEXT1664(local_2600);
      auVar58 = ZEXT1664(local_2610);
      auVar59 = ZEXT1664(local_2620);
      auVar56 = ZEXT1664(CONCAT412(fStack_2694,
                                   CONCAT48(fStack_2698,CONCAT44(fStack_269c,local_26a0))));
      auVar61 = ZEXT1664(CONCAT412(fStack_26a4,
                                   CONCAT48(fStack_26a8,CONCAT44(fStack_26ac,local_26b0))));
      auVar55 = ZEXT1664(CONCAT412(fStack_26b4,
                                   CONCAT48(fStack_26b8,CONCAT44(fStack_26bc,local_26c0))));
LAB_00678f75:
      auVar52 = ZEXT1664(local_25f0);
    }
    else {
      auVar4 = vblendvps_avx(local_2570,*(undefined1 (*) [16])(ray + 0x80),local_26e0._0_16_);
      auVar49 = ZEXT1664(auVar4);
      auVar34 = vshufps_avx(auVar4,auVar4,0xb1);
      auVar4 = vmaxps_avx(auVar34,auVar4);
      auVar34 = vshufpd_avx(auVar4,auVar4,1);
      auVar4 = vmaxss_avx(auVar34,auVar4);
      auVar52 = ZEXT1664(auVar4);
      auVar57 = ZEXT1664(local_2600);
      auVar58 = ZEXT1664(local_2610);
      auVar59 = ZEXT1664(local_2620);
      auVar56 = ZEXT1664(CONCAT412(fStack_2694,
                                   CONCAT48(fStack_2698,CONCAT44(fStack_269c,local_26a0))));
      auVar61 = ZEXT1664(CONCAT412(fStack_26a4,
                                   CONCAT48(fStack_26a8,CONCAT44(fStack_26ac,local_26b0))));
      auVar55 = ZEXT1664(CONCAT412(fStack_26b4,
                                   CONCAT48(fStack_26b8,CONCAT44(fStack_26bc,local_26c0))));
    }
  } while( true );
}

Assistant:

__forceinline vboolf4 operator ==(const vint4& a, const vint4& b) { return _mm_castsi128_ps(_mm_cmpeq_epi32(a, b)); }